

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevT.cpp
# Opt level: O0

void __thiscall OpenMD::ChebyshevT::GeneratePolynomials(ChebyshevT *this,int maxPower)

{
  int in_ESI;
  value_type *in_RDI;
  DoublePolynomial cn;
  int i;
  DoublePolynomial twoX;
  double *in_stack_ffffffffffffff00;
  Polynomial<double> *this_00;
  Polynomial<double> *in_stack_ffffffffffffff50;
  _Base_ptr in_stack_ffffffffffffff58;
  ChebyshevT *in_stack_ffffffffffffff80;
  Polynomial<double> *in_stack_ffffffffffffffa0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffac;
  Polynomial<double> local_40;
  int local_c;
  
  local_c = in_ESI;
  GenerateFirstTwoTerms(in_stack_ffffffffffffff80);
  this_00 = &local_40;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x3996aa);
  Polynomial<double>::setCoefficient(this_00,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff00)
  ;
  for (iVar1 = 2; iVar1 <= local_c; iVar1 = iVar1 + 1) {
    Polynomial<double>::Polynomial((Polynomial<double> *)0x399701);
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::
    operator[]((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
               &(in_RDI->polyPairMap_)._M_t._M_impl.super__Rb_tree_header,(long)(iVar1 + -1));
    OpenMD::operator*((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                      in_stack_ffffffffffffffa0);
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::
    operator[]((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
               &(in_RDI->polyPairMap_)._M_t._M_impl.super__Rb_tree_header,(long)(iVar1 + -2));
    OpenMD::operator-((Polynomial<double> *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    Polynomial<double>::operator=
              ((Polynomial<double> *)&stack0xffffffffffffff78,
               (Polynomial<double> *)&stack0xffffffffffffff48);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x399787);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x399791);
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
              ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
               this_00,in_RDI);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x3997b3);
  }
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x39982f);
  return;
}

Assistant:

void ChebyshevT::GeneratePolynomials(int maxPower) {
    GenerateFirstTwoTerms();

    DoublePolynomial twoX;
    twoX.setCoefficient(1, 2.0);

    // recursive generate the high order term of Chebyshev Polynomials
    // Cn+1(x) = Cn(x) * 2x - Cn-1(x)
    for (int i = 2; i <= maxPower; ++i) {
      DoublePolynomial cn;

      cn = polyList_[i - 1] * twoX - polyList_[i - 2];
      polyList_.push_back(cn);
    }
  }